

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite_correlated_expressions.cpp
# Opt level: O1

void __thiscall
duckdb::RewriteCorrelatedExpressions::VisitOperator
          (RewriteCorrelatedExpressions *this,LogicalOperator *op)

{
  pointer pCVar1;
  long lVar2;
  idx_t iVar3;
  reference pvVar4;
  type pLVar5;
  LogicalDependentJoin *pLVar6;
  iterator iVar7;
  CorrelatedColumnInfo *corr;
  pointer __k;
  
  if (this->recursive_rewrite == true) {
    if (op->type == LOGICAL_DEPENDENT_JOIN) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar4);
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this,pLVar5);
      this->lateral_depth = this->lateral_depth + 1;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,1);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar4);
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this,pLVar5);
      this->lateral_depth = this->lateral_depth - 1;
    }
    else {
      LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
    }
  }
  if (op->type == LOGICAL_DEPENDENT_JOIN) {
    pLVar6 = LogicalOperator::Cast<duckdb::LogicalDependentJoin>(op);
    pCVar1 = (pLVar6->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__k = (pLVar6->correlated_columns).
               super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               .
               super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_start; __k != pCVar1; __k = __k + 1) {
      iVar7 = ::std::
              _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this->correlated_map->_M_h,&__k->binding);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true>.
          _M_cur != (__node_type *)0x0) {
        lVar2 = *(long *)((long)iVar7.
                                super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true>
                                ._M_cur + 0x18);
        iVar3 = (this->base_binding).column_index;
        (__k->binding).table_index = (this->base_binding).table_index;
        (__k->binding).column_index = lVar2 + iVar3;
      }
    }
  }
  LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
  return;
}

Assistant:

void RewriteCorrelatedExpressions::VisitOperator(LogicalOperator &op) {
	if (recursive_rewrite) {
		// Update column bindings from left child of lateral to right child
		if (op.type == LogicalOperatorType::LOGICAL_DEPENDENT_JOIN) {
			D_ASSERT(op.children.size() == 2);
			VisitOperator(*op.children[0]);
			lateral_depth++;
			VisitOperator(*op.children[1]);
			lateral_depth--;
		} else {
			VisitOperatorChildren(op);
		}
	}
	// update the bindings in the correlated columns of the dependendent join
	if (op.type == LogicalOperatorType::LOGICAL_DEPENDENT_JOIN) {
		auto &plan = op.Cast<LogicalDependentJoin>();
		for (auto &corr : plan.correlated_columns) {
			auto entry = correlated_map.find(corr.binding);
			if (entry != correlated_map.end()) {
				corr.binding = ColumnBinding(base_binding.table_index, base_binding.column_index + entry->second);
			}
		}
	}
	VisitOperatorExpressions(op);
}